

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

uint32 __thiscall
Js::JavascriptArray::GetNextIndexHelper<double>(JavascriptArray *this,uint32 index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SparseArraySegmentBase *pSVar4;
  uint32 index_00;
  uint uVar5;
  ulong uVar6;
  uint32 uVar7;
  
  if ((this->head).ptr == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xae8,"(this->head)","array head should never be null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (index == 0xffffffff) {
    index_00 = ((this->head).ptr)->left;
  }
  else {
    index_00 = index + 1;
  }
  pSVar4 = GetBeginLookupSegment(this,index_00,true);
  do {
    if (pSVar4 == (SparseArraySegmentBase *)0x0) {
      return 0xffffffff;
    }
    uVar5 = index_00 - pSVar4->left;
    if ((pSVar4->left <= index_00) && (uVar5 < pSVar4->length)) {
      uVar7 = index_00;
      for (uVar6 = (ulong)uVar5; (uint)uVar6 < pSVar4->length; uVar6 = uVar6 + 1) {
        if (*(undefined1 **)(&pSVar4[1].left + uVar6 * 2) != &DAT_fff80002fff80002) {
          return uVar7;
        }
        uVar7 = uVar7 + 1;
      }
    }
    pSVar4 = (pSVar4->next).ptr;
    if ((pSVar4 != (SparseArraySegmentBase *)0x0) && (index_00 <= pSVar4->left)) {
      index_00 = pSVar4->left;
    }
  } while( true );
}

Assistant:

uint32 JavascriptArray::GetNextIndexHelper(uint32 index) const
    {
        AssertMsg(this->head, "array head should never be null");
        uint candidateIndex;

        if (index == JavascriptArray::InvalidIndex)
        {
            candidateIndex = head->left;
        }
        else
        {
            candidateIndex = index + 1;
        }

        SparseArraySegment<T>* current = (SparseArraySegment<T>*)this->GetBeginLookupSegment(candidateIndex);

        while (current != nullptr)
        {
            if ((current->left <= candidateIndex) && ((candidateIndex - current->left) < current->length))
            {
                for (uint i = candidateIndex - current->left; i < current->length; i++)
                {
                    if (!SparseArraySegment<T>::IsMissingItem(&current->elements[i]))
                    {
                        return i + current->left;
                    }
                }
            }
            current = SparseArraySegment<T>::From(current->next);
            if (current != NULL)
            {
                if (candidateIndex < current->left)
                {
                    candidateIndex = current->left;
                }
            }
        }
        return JavascriptArray::InvalidIndex;
    }